

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O3

void psh_hint_align(PSH_Hint_conflict hint,PSH_Globals globals,FT_Int dimension,PSH_Glyph glyph)

{
  FT_Bool FVar1;
  FT_Bool FVar2;
  int iVar3;
  PSH_Hint_conflict hint_00;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  FT_UInt FVar13;
  FT_Pos FVar14;
  int iVar15;
  FT_Pos FVar16;
  FT_Pos *pFVar17;
  ulong uVar18;
  long lVar19;
  bool bVar20;
  int local_58;
  int local_4c;
  
  FVar13 = hint->flags;
  if ((FVar13 & 8) != 0) {
    return;
  }
  lVar19 = (long)(int)globals->dimension[(uint)dimension].scale_mult;
  iVar15 = hint->org_pos;
  lVar4 = lVar19 * iVar15;
  uVar5 = (long)(int)((ulong)(lVar4 + 0x8000 + (lVar4 >> 0x3f)) >> 0x10) +
          globals->dimension[(uint)dimension].scale_delta;
  local_58 = hint->org_len;
  uVar10 = local_58 * lVar19 + 0x8000 + (local_58 * lVar19 >> 0x3f);
  iVar9 = (int)(uVar10 >> 0x10);
  uVar18 = (ulong)iVar9;
  if (dimension == 1) {
    if (glyph->do_vert_hints == '\0') {
LAB_002385d8:
      hint->cur_pos = uVar5;
      hint->cur_len = uVar18;
      goto LAB_002388b6;
    }
    FVar1 = glyph->do_vert_snapping;
    bVar20 = FVar1 != '\0';
    hint->cur_len = uVar18;
    FVar2 = (globals->blues).no_overshoots;
    FVar13 = (globals->blues).normal_top.count;
    local_4c = 2;
    if (FVar13 == 0) {
      FVar14 = 0;
      iVar11 = 0;
    }
    else {
      iVar11 = (globals->blues).blue_fuzz;
      pFVar17 = &(globals->blues).normal_top.zones[0].cur_ref;
      do {
        lVar4 = (long)(local_58 + iVar15) - (long)*(FT_Int *)((long)pFVar17 + -4);
        if (SBORROW8(lVar4,-(long)iVar11) != lVar4 + iVar11 < 0) break;
        if (local_58 + iVar15 <= *(int *)(pFVar17 + -1) + iVar11) {
          if ((FVar2 == '\0') && ((globals->blues).blue_threshold < lVar4)) {
            FVar14 = 0;
            iVar11 = 0;
          }
          else {
            FVar14 = *pFVar17;
            local_4c = 3;
            iVar11 = 1;
          }
          goto LAB_002386ee;
        }
        pFVar17 = pFVar17 + 6;
        FVar13 = FVar13 - 1;
      } while (FVar13 != 0);
      FVar14 = 0;
      iVar11 = 0;
    }
LAB_002386ee:
    uVar6 = (ulong)(globals->blues).normal_bottom.count;
    if (uVar6 != 0) {
      iVar3 = (globals->blues).blue_fuzz;
      pFVar17 = &(globals->blues).normal_bottom.zones[uVar6 - 1].cur_ref;
      while (lVar4 = (long)*(int *)(pFVar17 + -1) - (long)iVar15,
            SBORROW8(lVar4,-(long)iVar3) == lVar4 + iVar3 < 0) {
        if (*(FT_Int *)((long)pFVar17 + -4) - iVar3 <= iVar15) {
          if ((FVar2 == '\0') && ((globals->blues).blue_threshold <= lVar4)) {
            FVar16 = 0;
          }
          else {
            FVar16 = *pFVar17;
            iVar11 = local_4c;
          }
          goto LAB_00238781;
        }
        pFVar17 = pFVar17 + -6;
        uVar7 = (int)uVar6 - 1;
        uVar6 = (ulong)uVar7;
        if (uVar7 == 0) break;
      }
    }
    FVar16 = 0;
LAB_00238781:
    if (iVar11 == 1) {
      hint->cur_pos = FVar14 - uVar18;
      if (FVar1 != '\0') {
        uVar5 = 0x40;
        if (0x3f < (long)uVar18) {
          uVar5 = uVar18 + 0x20 & 0x7fffffffffffffc0;
        }
        hint->cur_pos = FVar14 - uVar5;
        goto LAB_002388ae;
      }
    }
    else if (iVar11 == 3) {
      hint->cur_pos = FVar16;
      hint->cur_len = FVar14 - FVar16;
    }
    else {
      if (iVar11 != 2) goto LAB_0023850a;
      hint->cur_pos = FVar16;
      if (FVar1 != '\0') {
        uVar5 = 0x40;
        if (0x3f < (long)uVar18) {
          uVar5 = uVar18 + 0x20 & 0x7fffffffffffffc0;
        }
        goto LAB_002388ae;
      }
    }
  }
  else {
    if (dimension == 0) {
      if (glyph->do_horz_hints == '\0') goto LAB_002385d8;
      bVar20 = glyph->do_horz_snapping != '\0';
    }
    else {
      bVar20 = false;
    }
    hint->cur_len = uVar18;
LAB_0023850a:
    hint_00 = hint->parent;
    if (hint_00 != (PSH_Hint_conflict)0x0) {
      if ((hint_00->flags & 8) == 0) {
        psh_hint_align(hint_00,globals,dimension,glyph);
        iVar15 = hint->org_pos;
        local_58 = hint->org_len;
      }
      lVar19 = lVar19 * ((iVar15 - ((hint_00->org_len >> 1) + hint_00->org_pos)) + (local_58 >> 1));
      uVar5 = (hint_00->cur_pos - ((long)((uVar10 >> 0x10) << 0x20) >> 0x21)) +
              (hint_00->cur_len >> 1) +
              (long)(int)((ulong)((lVar19 >> 0x3f) + lVar19 + 0x8000) >> 0x10);
    }
    uVar10 = uVar5;
    if (glyph->do_stem_adjust != '\0') {
      if (iVar9 < 0x41) {
        if (iVar9 < 0x20) {
          uVar6 = uVar5 + 0x20 & 0xffffffffffffffc0;
          uVar10 = uVar6;
          if (0 < iVar9) {
            uVar8 = uVar6 - uVar5;
            uVar10 = uVar5 + uVar18 + 0x20 & 0xffffffffffffffc0;
            uVar12 = uVar10 - (uVar5 + uVar18);
            uVar5 = -uVar8;
            if (0 < (long)uVar8) {
              uVar5 = uVar8;
            }
            uVar8 = -uVar12;
            if (0 < (long)uVar12) {
              uVar8 = uVar12;
            }
            if (uVar5 <= uVar8) {
              uVar10 = uVar6;
            }
          }
        }
        else {
          uVar10 = uVar5 + (uVar18 >> 1) & 0xffffffffffffffc0;
          uVar18 = 0x40;
        }
      }
      else {
        uVar5 = globals->dimension[(uint)dimension].stdw.widths[0].cur;
        uVar8 = uVar18 - uVar5;
        uVar6 = -uVar8;
        if (0 < (long)uVar8) {
          uVar6 = uVar8;
        }
        uVar8 = 0x30;
        if (0x30 < (long)uVar5) {
          uVar8 = uVar5;
        }
        if (uVar6 < 0x28) {
          uVar18 = uVar8;
        }
        if ((long)uVar18 < 0xc0) {
          uVar7 = (uint)uVar18 & 0x3f;
          if (9 < uVar7) {
            if (uVar7 < 0x20) {
              uVar18 = uVar18 & 0x7fffffffffffffc0 | 10;
            }
            else if (uVar7 < 0x36) {
              uVar18 = uVar18 & 0x7fffffffffffffc0 | 0x36;
            }
          }
        }
        else {
          uVar18 = uVar18 + 0x20 & 0x7fffffffffffffc0;
        }
      }
    }
    uVar8 = (uVar10 + 0x20 & 0xffffffffffffffc0) - uVar10;
    uVar5 = ((uVar10 + 0x20 + uVar18 & 0xffffffffffffffc0) - uVar10) - uVar18;
    uVar6 = -uVar8;
    if (0 < (long)uVar8) {
      uVar6 = uVar8;
    }
    uVar12 = -uVar5;
    if (0 < (long)uVar5) {
      uVar12 = uVar5;
    }
    if (uVar6 <= uVar12) {
      uVar5 = uVar8;
    }
    lVar4 = uVar5 + uVar10;
    hint->cur_pos = lVar4;
    hint->cur_len = uVar18;
    if (bVar20) {
      uVar5 = 0x40;
      if (0x3f < (long)uVar18) {
        uVar5 = uVar18 + 0x20 & 0x7fffffffffffffc0;
      }
      uVar18 = uVar5 >> 1;
      if ((uVar5 & 0x40) == 0) {
        uVar10 = lVar4 + uVar18 + 0x20 & 0xffffffffffffffc0;
      }
      else {
        uVar10 = lVar4 + uVar18 & 0xffffffffffffffc0 | 0x20;
      }
      hint->cur_pos = uVar10 - uVar18;
LAB_002388ae:
      hint->cur_len = uVar5;
    }
  }
  FVar13 = hint->flags;
LAB_002388b6:
  hint->flags = FVar13 | 8;
  return;
}

Assistant:

static void
  psh_hint_align( PSH_Hint     hint,
                  PSH_Globals  globals,
                  FT_Int       dimension,
                  PSH_Glyph    glyph )
  {
    PSH_Dimension  dim   = &globals->dimension[dimension];
    FT_Fixed       scale = dim->scale_mult;
    FT_Fixed       delta = dim->scale_delta;


    if ( !psh_hint_is_fitted( hint ) )
    {
      FT_Pos  pos = FT_MulFix( hint->org_pos, scale ) + delta;
      FT_Pos  len = FT_MulFix( hint->org_len, scale );

      FT_Int            do_snapping;
      FT_Pos            fit_len;
      PSH_AlignmentRec  align;


      /* ignore stem alignments when requested through the hint flags */
      if ( ( dimension == 0 && !glyph->do_horz_hints ) ||
           ( dimension == 1 && !glyph->do_vert_hints ) )
      {
        hint->cur_pos = pos;
        hint->cur_len = len;

        psh_hint_set_fitted( hint );
        return;
      }

      /* perform stem snapping when requested - this is necessary
       * for monochrome and LCD hinting modes only
       */
      do_snapping = ( dimension == 0 && glyph->do_horz_snapping ) ||
                    ( dimension == 1 && glyph->do_vert_snapping );

      hint->cur_len = fit_len = len;

      /* check blue zones for horizontal stems */
      align.align     = PSH_BLUE_ALIGN_NONE;
      align.align_bot = align.align_top = 0;

      if ( dimension == 1 )
        psh_blues_snap_stem( &globals->blues,
                             ADD_INT( hint->org_pos, hint->org_len ),
                             hint->org_pos,
                             &align );

      switch ( align.align )
      {
      case PSH_BLUE_ALIGN_TOP:
        /* the top of the stem is aligned against a blue zone */
        hint->cur_pos = align.align_top - fit_len;
        break;

      case PSH_BLUE_ALIGN_BOT:
        /* the bottom of the stem is aligned against a blue zone */
        hint->cur_pos = align.align_bot;
        break;

      case PSH_BLUE_ALIGN_TOP | PSH_BLUE_ALIGN_BOT:
        /* both edges of the stem are aligned against blue zones */
        hint->cur_pos = align.align_bot;
        hint->cur_len = align.align_top - align.align_bot;
        break;

      default:
        {
          PSH_Hint  parent = hint->parent;


          if ( parent )
          {
            FT_Pos  par_org_center, par_cur_center;
            FT_Pos  cur_org_center, cur_delta;


            /* ensure that parent is already fitted */
            if ( !psh_hint_is_fitted( parent ) )
              psh_hint_align( parent, globals, dimension, glyph );

            /* keep original relation between hints, this is, use the */
            /* scaled distance between the centers of the hints to    */
            /* compute the new position                               */
            par_org_center = parent->org_pos + ( parent->org_len >> 1 );
            par_cur_center = parent->cur_pos + ( parent->cur_len >> 1 );
            cur_org_center = hint->org_pos   + ( hint->org_len   >> 1 );

            cur_delta = FT_MulFix( cur_org_center - par_org_center, scale );
            pos       = par_cur_center + cur_delta - ( len >> 1 );
          }

          hint->cur_pos = pos;
          hint->cur_len = fit_len;

          /* Stem adjustment tries to snap stem widths to standard
           * ones.  This is important to prevent unpleasant rounding
           * artefacts.
           */
          if ( glyph->do_stem_adjust )
          {
            if ( len <= 64 )
            {
              /* the stem is less than one pixel; we will center it
               * around the nearest pixel center
               */
              if ( len >= 32 )
              {
                /* This is a special case where we also widen the stem
                 * and align it to the pixel grid.
                 *
                 *   stem_center          = pos + (len/2)
                 *   nearest_pixel_center = FT_ROUND(stem_center-32)+32
                 *   new_pos              = nearest_pixel_center-32
                 *                        = FT_ROUND(stem_center-32)
                 *                        = FT_FLOOR(stem_center-32+32)
                 *                        = FT_FLOOR(stem_center)
                 *   new_len              = 64
                 */
                pos = FT_PIX_FLOOR( pos + ( len >> 1 ) );
                len = 64;
              }
              else if ( len > 0 )
              {
                /* This is a very small stem; we simply align it to the
                 * pixel grid, trying to find the minimum displacement.
                 *
                 * left               = pos
                 * right              = pos + len
                 * left_nearest_edge  = ROUND(pos)
                 * right_nearest_edge = ROUND(right)
                 *
                 * if ( ABS(left_nearest_edge - left) <=
                 *      ABS(right_nearest_edge - right) )
                 *    new_pos = left
                 * else
                 *    new_pos = right
                 */
                FT_Pos  left_nearest  = FT_PIX_ROUND( pos );
                FT_Pos  right_nearest = FT_PIX_ROUND( pos + len );
                FT_Pos  left_disp     = left_nearest - pos;
                FT_Pos  right_disp    = right_nearest - ( pos + len );


                if ( left_disp < 0 )
                  left_disp = -left_disp;
                if ( right_disp < 0 )
                  right_disp = -right_disp;
                if ( left_disp <= right_disp )
                  pos = left_nearest;
                else
                  pos = right_nearest;
              }
              else
              {
                /* this is a ghost stem; we simply round it */
                pos = FT_PIX_ROUND( pos );
              }
            }
            else
            {
              len = psh_dimension_quantize_len( dim, len, 0 );
            }
          }

          /* now that we have a good hinted stem width, try to position */
          /* the stem along a pixel grid integer coordinate             */
          hint->cur_pos = pos + psh_hint_snap_stem_side_delta( pos, len );
          hint->cur_len = len;
        }
      }

      if ( do_snapping )
      {
        pos = hint->cur_pos;
        len = hint->cur_len;

        if ( len < 64 )
          len = 64;
        else
          len = FT_PIX_ROUND( len );

        switch ( align.align )
        {
          case PSH_BLUE_ALIGN_TOP:
            hint->cur_pos = align.align_top - len;
            hint->cur_len = len;
            break;

          case PSH_BLUE_ALIGN_BOT:
            hint->cur_len = len;
            break;

          case PSH_BLUE_ALIGN_BOT | PSH_BLUE_ALIGN_TOP:
            /* don't touch */
            break;


          default:
            hint->cur_len = len;
            if ( len & 64 )
              pos = FT_PIX_FLOOR( pos + ( len >> 1 ) ) + 32;
            else
              pos = FT_PIX_ROUND( pos + ( len >> 1 ) );

            hint->cur_pos = pos - ( len >> 1 );
            hint->cur_len = len;
        }
      }

      psh_hint_set_fitted( hint );

#ifdef DEBUG_HINTER
      if ( ps_debug_hint_func )
        ps_debug_hint_func( hint, dimension );
#endif
    }
  }